

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucharstriebuilder.cpp
# Opt level: O1

int32_t __thiscall
icu_63::UCharsTrieBuilder::countElementUnits
          (UCharsTrieBuilder *this,int32_t start,int32_t limit,int32_t unitIndex)

{
  short sVar1;
  int32_t iVar2;
  int iVar3;
  uint uVar4;
  int32_t iVar5;
  char16_t cVar6;
  int32_t i;
  uint uVar7;
  char16_t *pcVar8;
  char16_t cVar9;
  long lVar10;
  
  sVar1 = (this->strings).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar7 = *(uint *)((long)&(this->strings).fUnion + 4);
  }
  else {
    uVar7 = (int)sVar1 >> 5;
  }
  if (((int)sVar1 & 2U) == 0) {
    pcVar8 = (this->strings).fUnion.fFields.fArray;
  }
  else {
    pcVar8 = (char16_t *)((long)&(this->strings).fUnion + 2);
  }
  iVar3 = 0;
  do {
    lVar10 = (long)start;
    uVar4 = this->elements[lVar10].stringOffset + unitIndex + 1;
    cVar9 = L'\xffff';
    if (uVar4 < uVar7) {
      cVar9 = pcVar8[(int)uVar4];
    }
    iVar5 = start + 1;
    if (start + 1 < limit) {
      iVar5 = limit;
    }
    do {
      lVar10 = lVar10 + 1;
      iVar2 = iVar5;
      if (limit <= lVar10) break;
      uVar4 = this->elements[lVar10].stringOffset + unitIndex + 1;
      cVar6 = L'\xffff';
      if (uVar4 < uVar7) {
        cVar6 = pcVar8[(int)uVar4];
      }
      start = start + 1;
      iVar2 = start;
    } while (cVar9 == cVar6);
    start = iVar2;
    iVar3 = iVar3 + 1;
    if (limit <= lVar10) {
      return iVar3;
    }
  } while( true );
}

Assistant:

int32_t
UCharsTrieBuilder::countElementUnits(int32_t start, int32_t limit, int32_t unitIndex) const {
    int32_t length=0;  // Number of different units at unitIndex.
    int32_t i=start;
    do {
        UChar unit=elements[i++].charAt(unitIndex, strings);
        while(i<limit && unit==elements[i].charAt(unitIndex, strings)) {
            ++i;
        }
        ++length;
    } while(i<limit);
    return length;
}